

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2LoadShift(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  DecodeStatus DVar6;
  uint Rn;
  uint Rt;
  uint addrmode;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rt = 3;
  _addrmode = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  if (uVar3 == 0xf) {
    uVar4 = MCInst_getOpcode(pMStack_18);
    if (uVar4 == 0x949) {
      MCInst_setOpcode(pMStack_18,0x947);
    }
    else if (uVar4 == 0x958) {
      MCInst_setOpcode(pMStack_18,0x956);
    }
    else if (uVar4 == 0x960) {
      MCInst_setOpcode(pMStack_18,0x95e);
    }
    else if (uVar4 == 0x968) {
      MCInst_setOpcode(pMStack_18,0x966);
    }
    else if (uVar4 == 0x971) {
      MCInst_setOpcode(pMStack_18,0x96e);
    }
    else if (uVar4 == 0x9b0) {
      MCInst_setOpcode(pMStack_18,0x9af);
    }
    else {
      if (uVar4 != 0x9b4) {
        return MCDisassembler_Fail;
      }
      MCInst_setOpcode(pMStack_18,0x9b3);
    }
    Inst_local._4_4_ =
         DecodeT2LoadLabel(pMStack_18,Address_local._4_4_,(uint64_t)Decoder_local,_addrmode);
  }
  else {
    if (uVar2 == 0xf) {
      uVar4 = MCInst_getOpcode(pMStack_18);
      if (uVar4 == 0x958) {
        MCInst_setOpcode(pMStack_18,0x9ac);
      }
      else if (uVar4 == 0x968) {
        return MCDisassembler_Fail;
      }
    }
    uVar4 = MCInst_getOpcode(pMStack_18);
    if (((uVar4 != 0x9ac) && (uVar4 != 0x9b0)) && (uVar4 != 0x9b4)) {
      DVar6 = DecodeGPRRegisterClass(pMStack_18,uVar2,(uint64_t)Decoder_local,_addrmode);
      _Var1 = Check(&Rt,DVar6);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    uVar2 = fieldFromInstruction_4(Address_local._4_4_,4,2);
    uVar3 = fieldFromInstruction_4(Address_local._4_4_,0,4);
    uVar5 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
    DVar6 = DecodeT2AddrModeSOReg
                      (pMStack_18,uVar5 << 6 | uVar3 << 2 | uVar2,(uint64_t)Decoder_local,_addrmode)
    ;
    _Var1 = Check(&Rt,DVar6);
    if (_Var1) {
      Inst_local._4_4_ = Rt;
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeT2LoadShift(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned addrmode;
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRBs:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRHs:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHs:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2LDRSBs:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRs:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2PLDs:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIs:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}

		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHs:
				return MCDisassembler_Fail;
			case ARM_t2LDRHs:
				// FIXME: this instruction is only available with MP extensions,
				// this should be checked first but we don't have access to the
				// feature bits here.
				MCInst_setOpcode(Inst, ARM_t2PLDWs);
				break;
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDs:
		case ARM_t2PLDWs:
		case ARM_t2PLIs:
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	addrmode = fieldFromInstruction_4(Insn, 4, 2);
	addrmode |= fieldFromInstruction_4(Insn, 0, 4) << 2;
	addrmode |= fieldFromInstruction_4(Insn, 16, 4) << 6;
	if (!Check(&S, DecodeT2AddrModeSOReg(Inst, addrmode, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}